

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall wallet::SQLiteDatabase::Verify(SQLiteDatabase *this,bilingual_str *error)

{
  bool bVar1;
  int iVar2;
  _Optional_payload_base<int> fmt;
  uint32_t *puVar3;
  _Optional_payload_base<int> args;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long in_RDI;
  long in_FS_OFFSET;
  char *msg;
  int ret;
  sqlite3_stmt *stmt;
  int32_t user_ver;
  uint32_t net_magic;
  uint32_t app_id;
  optional<int> read_result;
  string str_msg;
  CChainParams *in_stack_fffffffffffffa38;
  bilingual_str *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4f;
  bilingual_str *pbVar5;
  char *fmt_00;
  string *in_stack_fffffffffffffa70;
  allocator<char> *in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  ConstevalStringLiteral in_stack_fffffffffffffa88;
  bilingual_str *fmt_01;
  bilingual_str *in_stack_fffffffffffffaa8;
  string *in_stack_fffffffffffffab0;
  uint *args_01;
  string *in_stack_fffffffffffffab8;
  sqlite3 *db;
  bool local_4b3;
  undefined1 local_4b2 [26];
  undefined8 local_498;
  int local_48c;
  undefined1 local_486;
  undefined1 local_485 [12];
  allocator<char> local_479;
  _Optional_payload_base<int> local_478;
  undefined8 local_470;
  undefined1 local_188 [192];
  uint local_c8 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 200) == 0) {
    __assert_fail("m_db",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0xc0,"bool wallet::SQLiteDatabase::Verify(bilingual_str &)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  db = (sqlite3 *)(local_485 + 0xb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  fmt = (_Optional_payload_base<int>)
        ReadPragmaInteger(db,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                          in_stack_fffffffffffffaa8);
  local_470 = fmt;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator((allocator<char> *)(local_485 + 0xb));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator(&local_479);
  bVar1 = std::optional<int>::has_value((optional<int> *)in_stack_fffffffffffffa38);
  if (bVar1) {
    puVar3 = (uint32_t *)
             std::optional<int>::value
                       ((optional<int> *)
                        CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48));
    local_485._5_4_ = *puVar3;
    Params();
    CChainParams::MessageStart(in_stack_fffffffffffffa38);
    std::array<unsigned_char,_4UL>::data((array<unsigned_char,_4UL> *)in_stack_fffffffffffffa38);
    local_485._1_4_ = ReadBE32((uchar *)in_stack_fffffffffffffa40);
    if (local_485._5_4_ == local_485._1_4_) {
      pbVar5 = (bilingual_str *)local_485;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      fmt_01 = (bilingual_str *)&local_486;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      args = (_Optional_payload_base<int>)
             ReadPragmaInteger(db,(string *)fmt,in_stack_fffffffffffffab0,pbVar5);
      local_478 = args;
      local_470 = args;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa38);
      std::allocator<char>::~allocator((allocator<char> *)&local_486);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa38);
      std::allocator<char>::~allocator((allocator<char> *)local_485);
      bVar1 = std::optional<int>::has_value((optional<int> *)in_stack_fffffffffffffa38);
      if (bVar1) {
        piVar4 = std::optional<int>::value
                           ((optional<int> *)
                            CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48));
        local_48c = *piVar4;
        if (local_48c == 0) {
          local_498 = 0;
          iVar2 = sqlite3_prepare_v2(*(undefined8 *)(in_RDI + 200),"PRAGMA integrity_check",
                                     0xffffffff,&local_498,0);
          if (iVar2 == 0) {
            while (iVar2 = sqlite3_step(local_498), iVar2 != 0x65) {
              if (iVar2 != 100) {
                ::_(in_stack_fffffffffffffa88);
                local_4b2._10_8_ = sqlite3_errstr(iVar2);
                tinyformat::format<char_const*>(fmt_01,(char **)args);
                bilingual_str::operator=
                          ((bilingual_str *)
                           CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                           in_stack_fffffffffffffa40);
                bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                break;
              }
              args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        sqlite3_column_text(local_498,0);
              if (args_00 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::_(in_stack_fffffffffffffa88);
                local_4b2._2_8_ = sqlite3_errstr(100);
                tinyformat::format<char_const*>(fmt_01,(char **)args);
                bilingual_str::operator=
                          ((bilingual_str *)
                           CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                           in_stack_fffffffffffffa40);
                bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                break;
              }
              fmt_00 = local_4b2 + 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,
                         in_stack_fffffffffffffa78);
              std::allocator<char>::~allocator((allocator<char> *)(local_4b2 + 1));
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffa4f,
                                                  in_stack_fffffffffffffa48),
                                      (char *)in_stack_fffffffffffffa40);
              if (!bVar1) {
                bVar1 = bilingual_str::empty((bilingual_str *)in_stack_fffffffffffffa38);
                if (bVar1) {
                  ::_(in_stack_fffffffffffffa88);
                  pbVar5 = (bilingual_str *)local_4b2;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa88.lit,in_stack_fffffffffffffa80,
                             in_stack_fffffffffffffa78);
                  Untranslated(in_stack_fffffffffffffa70);
                  ::operator+(pbVar5,(bilingual_str *)
                                     CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48));
                  bilingual_str::operator=
                            ((bilingual_str *)
                             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                             in_stack_fffffffffffffa40);
                  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa38);
                  std::allocator<char>::~allocator((allocator<char> *)local_4b2);
                  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                }
                tinyformat::format<std::__cxx11::string>(fmt_00,args_00);
                Untranslated(in_stack_fffffffffffffa70);
                bilingual_str::operator+=
                          ((bilingual_str *)
                           CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                           in_stack_fffffffffffffa40);
                bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa38);
              }
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa38);
            }
            sqlite3_finalize(local_498);
            local_4b3 = bilingual_str::empty((bilingual_str *)in_stack_fffffffffffffa38);
          }
          else {
            sqlite3_finalize(local_498);
            ::_(in_stack_fffffffffffffa88);
            local_4b2._18_8_ = sqlite3_errstr(iVar2);
            tinyformat::format<char_const*>(fmt_01,(char **)args);
            bilingual_str::operator=
                      ((bilingual_str *)
                       CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                       in_stack_fffffffffffffa40);
            bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
            bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
            local_4b3 = false;
          }
        }
        else {
          ::_((ConstevalStringLiteral)local_188);
          tinyformat::format<int,int>
                    ((bilingual_str *)fmt,(int *)in_stack_fffffffffffffab0,(int *)pbVar5);
          bilingual_str::operator=
                    ((bilingual_str *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                     in_stack_fffffffffffffa40);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
          local_4b3 = false;
        }
      }
      else {
        local_4b3 = false;
      }
    }
    else {
      args_01 = local_c8;
      ::_(in_stack_fffffffffffffa88);
      tinyformat::format<unsigned_int,unsigned_int>
                ((bilingual_str *)fmt,args_01,(uint *)in_stack_fffffffffffffaa8);
      bilingual_str::operator=
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 in_stack_fffffffffffffa40);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffa38);
      local_4b3 = false;
    }
  }
  else {
    local_4b3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4b3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteDatabase::Verify(bilingual_str& error)
{
    assert(m_db);

    // Check the application ID matches our network magic
    auto read_result = ReadPragmaInteger(m_db, "application_id", "the application id", error);
    if (!read_result.has_value()) return false;
    uint32_t app_id = static_cast<uint32_t>(read_result.value());
    uint32_t net_magic = ReadBE32(Params().MessageStart().data());
    if (app_id != net_magic) {
        error = strprintf(_("SQLiteDatabase: Unexpected application id. Expected %u, got %u"), net_magic, app_id);
        return false;
    }

    // Check our schema version
    read_result = ReadPragmaInteger(m_db, "user_version", "sqlite wallet schema version", error);
    if (!read_result.has_value()) return false;
    int32_t user_ver = read_result.value();
    if (user_ver != WALLET_SCHEMA_VERSION) {
        error = strprintf(_("SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"), user_ver, WALLET_SCHEMA_VERSION);
        return false;
    }

    sqlite3_stmt* stmt{nullptr};
    int ret = sqlite3_prepare_v2(m_db, "PRAGMA integrity_check", -1, &stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(stmt);
        error = strprintf(_("SQLiteDatabase: Failed to prepare statement to verify database: %s"), sqlite3_errstr(ret));
        return false;
    }
    while (true) {
        ret = sqlite3_step(stmt);
        if (ret == SQLITE_DONE) {
            break;
        }
        if (ret != SQLITE_ROW) {
            error = strprintf(_("SQLiteDatabase: Failed to execute statement to verify database: %s"), sqlite3_errstr(ret));
            break;
        }
        const char* msg = (const char*)sqlite3_column_text(stmt, 0);
        if (!msg) {
            error = strprintf(_("SQLiteDatabase: Failed to read database verification error: %s"), sqlite3_errstr(ret));
            break;
        }
        std::string str_msg(msg);
        if (str_msg == "ok") {
            continue;
        }
        if (error.empty()) {
            error = _("Failed to verify database") + Untranslated("\n");
        }
        error += Untranslated(strprintf("%s\n", str_msg));
    }
    sqlite3_finalize(stmt);
    return error.empty();
}